

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

string * google::protobuf::compiler::php::RootPhpNamespace<google::protobuf::Descriptor>
                   (Descriptor *desc,bool is_descriptor)

{
  bool bVar1;
  FileDescriptor *pFVar2;
  ulong uVar3;
  byte in_DL;
  Descriptor *in_RSI;
  string *in_RDI;
  string *php_namespace;
  bool in_stack_00000097;
  string *in_stack_00000098;
  allocator local_35 [20];
  allocator local_21;
  string *local_20;
  byte local_11;
  Descriptor *local_10;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  pFVar2 = Descriptor::file(in_RSI);
  FileDescriptor::options(pFVar2);
  bVar1 = FileOptions::has_php_namespace((FileOptions *)0x4aec6d);
  if (bVar1) {
    pFVar2 = Descriptor::file(local_10);
    FileDescriptor::options(pFVar2);
    local_20 = FileOptions::php_namespace_abi_cxx11_((FileOptions *)0x4aec90);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      std::__cxx11::string::string((string *)in_RDI,(string *)local_20);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"",&local_21);
      std::allocator<char>::~allocator((allocator<char> *)&local_21);
    }
  }
  else {
    pFVar2 = Descriptor::file(local_10);
    FileDescriptor::package_abi_cxx11_(pFVar2);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      pFVar2 = Descriptor::file(local_10);
      FileDescriptor::package_abi_cxx11_(pFVar2);
      PhpName(in_stack_00000098,in_stack_00000097);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"",local_35);
      std::allocator<char>::~allocator((allocator<char> *)local_35);
    }
  }
  return in_RDI;
}

Assistant:

std::string RootPhpNamespace(const DescriptorType* desc, bool is_descriptor) {
  if (desc->file()->options().has_php_namespace()) {
    const string& php_namespace = desc->file()->options().php_namespace();
    if (!php_namespace.empty()) {
      return php_namespace;
    }
    return "";
  }

  if (!desc->file()->package().empty()) {
    return PhpName(desc->file()->package(), is_descriptor);
  }
  return "";
}